

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

HighsStatus
writeModelAsMps(HighsOptions *options,string *filename,HighsModel *model,bool free_format)

{
  HighsStatus HVar1;
  size_type sVar2;
  uint *puVar3;
  byte in_CL;
  long in_RDX;
  string *in_RSI;
  long in_RDI;
  bool in_stack_000000cf;
  HighsInt *in_stack_000000d0;
  HighsInt *in_stack_000000d8;
  HighsInt *in_stack_000000e0;
  string *in_stack_000000e8;
  string *in_stack_000000f0;
  HighsLogOptions *in_stack_000000f8;
  ObjSense *in_stack_00000110;
  double *in_stack_00000118;
  vector<double,_std::allocator<double>_> *in_stack_00000120;
  vector<double,_std::allocator<double>_> *in_stack_00000128;
  vector<double,_std::allocator<double>_> *in_stack_00000130;
  vector<double,_std::allocator<double>_> *in_stack_00000138;
  vector<double,_std::allocator<double>_> *in_stack_00000140;
  vector<int,_std::allocator<int>_> *in_stack_00000148;
  vector<int,_std::allocator<int>_> *in_stack_00000150;
  vector<double,_std::allocator<double>_> *in_stack_00000158;
  vector<int,_std::allocator<int>_> *in_stack_00000160;
  vector<int,_std::allocator<int>_> *in_stack_00000168;
  vector<double,_std::allocator<double>_> *in_stack_00000170;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_00000178;
  string *in_stack_00000180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000190;
  HighsStatus write_status;
  string local_objective_name;
  bool use_free_format;
  HighsInt max_name_length;
  HighsStatus row_name_status;
  HighsInt max_row_name_length;
  HighsStatus col_name_status;
  HighsInt max_col_name_length;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_row_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_col_names;
  bool have_row_names;
  bool have_col_names;
  HighsHessian *hessian;
  HighsLp *lp;
  bool warning_found;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd00;
  size_type in_stack_fffffffffffffd08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd10;
  HighsHessian *in_stack_fffffffffffffd50;
  HighsLp *in_stack_fffffffffffffd58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  HighsInt *in_stack_fffffffffffffd98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  HighsInt num_name;
  string *in_stack_fffffffffffffdb0;
  HighsLogOptions *in_stack_fffffffffffffdb8;
  byte local_1dd;
  byte local_1c5;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [36];
  HighsStatus local_13c;
  string local_138 [39];
  byte local_111;
  uint local_110;
  allocator local_109;
  string local_108 [32];
  HighsStatus local_e8;
  int local_e4 [2];
  allocator local_d9;
  string local_d8 [36];
  HighsStatus local_b4;
  int local_b0 [17];
  byte local_6a;
  byte local_69;
  long local_68;
  long local_60;
  byte local_52;
  byte local_51;
  long local_40;
  HighsStatus local_34;
  
  num_name = (HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  local_51 = in_CL & 1;
  local_52 = 0;
  local_68 = in_RDX + 0x398;
  local_60 = in_RDX;
  local_40 = in_RDI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDX + 0x148));
  local_69 = sVar2 != 0;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_60 + 0x160));
  local_6a = sVar2 != 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x474b4d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x474b5a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  if ((local_69 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  if ((local_6a & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  local_b0[0] = 0x7fffffff;
  if ((local_51 & 1) == 0) {
    local_b0[0] = 8;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"column",&local_d9);
  HVar1 = normaliseNames(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,num_name,
                         in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  local_b4 = HVar1;
  if (HVar1 == kError) {
    local_e4[1] = 1;
    local_34 = kError;
  }
  else {
    local_1c5 = 1;
    if (HVar1 != kWarning) {
      local_1c5 = local_52;
    }
    local_52 = local_1c5 & 1;
    local_e4[0] = 0x7fffffff;
    if ((local_51 & 1) == 0) {
      local_e4[0] = 8;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"row",&local_109);
    HVar1 = normaliseNames(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,num_name,
                           in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    local_e8 = HVar1;
    if (HVar1 == kError) {
      local_e4[1] = 1;
      local_34 = kError;
    }
    else {
      local_1dd = 1;
      if (HVar1 != kWarning) {
        local_1dd = local_52;
      }
      local_52 = local_1dd & 1;
      puVar3 = (uint *)std::max<int>(local_b0,local_e4);
      local_110 = *puVar3;
      local_111 = local_51 & 1;
      if (((local_51 & 1) == 0) && (8 < (int)local_110)) {
        highsLogUser((HighsLogOptions *)(local_40 + 0x380),kWarning,
                     "Maximum name length is %d so using free format rather than fixed format\n",
                     (ulong)local_110);
        local_111 = 1;
        local_52 = 1;
      }
      findModelObjectiveName_abi_cxx11_(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      std::__cxx11::string::string(local_160,in_RSI);
      std::__cxx11::string::string(local_180,(string *)(local_60 + 0x100));
      in_stack_fffffffffffffd00 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_60 + 0x20);
      std::__cxx11::string::string(local_1a0,local_138);
      HVar1 = writeMps(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                       in_stack_000000d8,in_stack_000000d0,in_stack_00000110,in_stack_00000118,
                       in_stack_00000120,in_stack_00000128,in_stack_00000130,in_stack_00000138,
                       in_stack_00000140,in_stack_00000148,in_stack_00000150,in_stack_00000158,
                       in_stack_00000160,in_stack_00000168,in_stack_00000170,in_stack_00000178,
                       in_stack_00000180,in_stack_00000188,in_stack_00000190,in_stack_000000cf);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_160);
      local_34 = HVar1;
      if ((HVar1 == kOk) && ((local_52 & 1) != 0)) {
        local_34 = kWarning;
      }
      local_e4[1] = 1;
      local_13c = HVar1;
      std::__cxx11::string::~string(local_138);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffd00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffd00);
  return local_34;
}

Assistant:

HighsStatus writeModelAsMps(const HighsOptions& options,
                            const std::string filename, const HighsModel& model,
                            const bool free_format) {
  bool warning_found = false;
  const HighsLp& lp = model.lp_;
  const HighsHessian& hessian = model.hessian_;
  bool have_col_names = (lp.col_names_.size() != 0);
  bool have_row_names = (lp.row_names_.size() != 0);
  std::vector<std::string> local_col_names;
  std::vector<std::string> local_row_names;
  local_col_names.resize(lp.num_col_);
  local_row_names.resize(lp.num_row_);
  // Initialise the local names to any existing names
  if (have_col_names) local_col_names = lp.col_names_;
  if (have_row_names) local_row_names = lp.row_names_;
  //
  // Normalise the column names
  HighsInt max_col_name_length = kHighsIInf;
  if (!free_format) max_col_name_length = 8;
  HighsStatus col_name_status =
      normaliseNames(options.log_options, "column", lp.num_col_,
                     local_col_names, max_col_name_length);
  if (col_name_status == HighsStatus::kError) return col_name_status;
  warning_found = col_name_status == HighsStatus::kWarning || warning_found;
  //
  // Normalise the row names
  HighsInt max_row_name_length = kHighsIInf;
  if (!free_format) max_row_name_length = 8;
  HighsStatus row_name_status =
      normaliseNames(options.log_options, "row", lp.num_row_, local_row_names,
                     max_row_name_length);
  if (row_name_status == HighsStatus::kError) return row_name_status;
  warning_found = row_name_status == HighsStatus::kWarning || warning_found;

  HighsInt max_name_length = std::max(max_col_name_length, max_row_name_length);
  bool use_free_format = free_format;
  if (!free_format) {
    if (max_name_length > 8) {
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "Maximum name length is %" HIGHSINT_FORMAT
                   " so using free format rather "
                   "than fixed format\n",
                   max_name_length);
      use_free_format = true;
      warning_found = true;
    }
  }
  // Set a local objective name, creating one if necessary
  const std::string local_objective_name =
      findModelObjectiveName(&lp, &hessian);
  // If there is Hessian data to write out, writeMps assumes that hessian is
  // triangular
  if (hessian.dim_) assert(hessian.format_ == HessianFormat::kTriangular);

  HighsStatus write_status = writeMps(
      options.log_options, filename, lp.model_name_, lp.num_row_, lp.num_col_,
      hessian.dim_, lp.sense_, lp.offset_, lp.col_cost_, lp.col_lower_,
      lp.col_upper_, lp.row_lower_, lp.row_upper_, lp.a_matrix_.start_,
      lp.a_matrix_.index_, lp.a_matrix_.value_, hessian.start_, hessian.index_,
      hessian.value_, lp.integrality_, local_objective_name, local_col_names,
      local_row_names, use_free_format);
  if (write_status == HighsStatus::kOk && warning_found)
    return HighsStatus::kWarning;
  return write_status;
}